

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_stack.c
# Opt level: O3

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len)

{
  uint uVar1;
  uint uVar2;
  void **__dest;
  ulong uVar3;
  ulong uVar4;
  void **__src;
  
  if (self != (adt_stack_t *)0x0) {
    uVar4 = (ulong)u32Len;
    uVar1 = self->u32AllocLen;
    uVar3 = (ulong)uVar1;
    if (uVar1 != u32Len) {
      uVar2 = self->u32CurLen;
      if (uVar1 < uVar2) {
        __assert_fail("self->u32AllocLen>=self->u32CurLen",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_stack.c"
                      ,0x7c,"void adt_stack_resize(adt_stack_t *, uint32_t)");
      }
      if (u32Len == 0) {
        __dest = (void **)0x0;
      }
      else {
        __dest = (void **)malloc(uVar4 << 3);
        if (__dest == (void **)0x0) {
          __assert_fail("ppAlloc != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_stack.c"
                        ,0x7f,"void adt_stack_resize(adt_stack_t *, uint32_t)");
        }
      }
      __src = self->ppAlloc;
      if (__src != (void **)0x0) {
        if (((u32Len <= uVar1) && (uVar3 = uVar4, u32Len < uVar2)) &&
           (self->pDestructor != (_func_void_void_ptr *)0x0)) {
          do {
            (*self->pDestructor)(self->ppAlloc[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 < self->u32CurLen);
          __src = self->ppAlloc;
        }
        memcpy(__dest,__src,uVar3 << 3);
        free(__src);
      }
      self->ppAlloc = __dest;
      self->u32AllocLen = u32Len;
    }
  }
  return;
}

Assistant:

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len){
	void **ppAlloc = (void**) 0;
	if(!self) return;
	if(u32Len == self->u32AllocLen) return; //nothing to do

	assert(self->u32AllocLen>=self->u32CurLen);
	if(u32Len>0){
		ppAlloc = (void**) malloc(u32Len * sizeof(void*));
		assert(ppAlloc != 0);
	}
	if(self->ppAlloc){
		if(u32Len > self->u32AllocLen){
			//grow
			memcpy(ppAlloc,self->ppAlloc,self->u32AllocLen * sizeof(void*));
		}
		else{
			//shrink
			if( self->u32CurLen > u32Len){
				//call destructor on superfluous elements
				if(self->pDestructor){
					uint32_t u32i;
					for(u32i=u32Len; u32i < self->u32CurLen;u32i++){
						self->pDestructor(self->ppAlloc[u32i]);
					}
				}
			}
			memcpy(ppAlloc,self->ppAlloc,u32Len * sizeof(void*));
		}
		free(self->ppAlloc);
	}
	self->ppAlloc = ppAlloc;
	self->u32AllocLen = u32Len;

}